

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::ProgramSizeBigProgram(void)

{
  int iVar1;
  int iVar2;
  RE2 re_medium;
  RE2 re_simple;
  RE2 re_complex;
  LogMessageFatal LStack_428;
  RE2 local_2a8;
  RE2 local_1c8;
  RE2 local_e8;
  
  RE2::RE2(&local_1c8,"simple regexp");
  RE2::RE2(&local_2a8,"medium.*regexp");
  RE2::RE2(&local_e8,"complex.{1,128}regexp");
  iVar1 = RE2::ProgramSize(&local_1c8);
  if (iVar1 < 1) {
    LogMessageFatal::LogMessageFatal
              (&LStack_428,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1d4);
    std::operator<<((ostream *)&LStack_428.super_LogMessage.str_,
                    "Check failed: (re_simple.ProgramSize()) > (0)");
    LogMessageFatal::~LogMessageFatal(&LStack_428);
  }
  iVar1 = RE2::ProgramSize(&local_2a8);
  iVar2 = RE2::ProgramSize(&local_1c8);
  if (iVar1 <= iVar2) {
    LogMessageFatal::LogMessageFatal
              (&LStack_428,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1d5);
    std::operator<<((ostream *)&LStack_428.super_LogMessage.str_,
                    "Check failed: (re_medium.ProgramSize()) > (re_simple.ProgramSize())");
    LogMessageFatal::~LogMessageFatal(&LStack_428);
  }
  iVar1 = RE2::ProgramSize(&local_e8);
  iVar2 = RE2::ProgramSize(&local_2a8);
  if (iVar1 <= iVar2) {
    LogMessageFatal::LogMessageFatal
              (&LStack_428,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1d6);
    std::operator<<((ostream *)&LStack_428.super_LogMessage.str_,
                    "Check failed: (re_complex.ProgramSize()) > (re_medium.ProgramSize())");
    LogMessageFatal::~LogMessageFatal(&LStack_428);
  }
  RE2::~RE2(&local_e8);
  RE2::~RE2(&local_2a8);
  RE2::~RE2(&local_1c8);
  return;
}

Assistant:

TEST(ProgramSize, BigProgram) {
  RE2 re_simple("simple regexp");
  RE2 re_medium("medium.*regexp");
  RE2 re_complex("complex.{1,128}regexp");

  CHECK_GT(re_simple.ProgramSize(), 0);
  CHECK_GT(re_medium.ProgramSize(), re_simple.ProgramSize());
  CHECK_GT(re_complex.ProgramSize(), re_medium.ProgramSize());
}